

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O2

size_t io::net::
       read<io::basic_string_view_stream<char,std::char_traits<char>>,io::net::dynamic_vector_buffer<char,std::allocator<char>>,io::net::transfer_exactly,void>
                 (basic_string_view_stream<char,_std::char_traits<char>_> *stream,
                 dynamic_vector_buffer<char,_std::allocator<char>_> *b,
                 transfer_exactly completion_condition,error_code *ec)

{
  ulong uVar1;
  size_t n;
  ulong uVar2;
  ulong n_00;
  size_t sVar3;
  ulong uVar4;
  mutable_buffers_type buf;
  mutable_buffers_type local_40;
  
  std::error_code::clear(ec);
  uVar1 = b->size_;
  uVar2 = b->max_size_;
  n_00 = uVar2 - uVar1;
  if (0xffff < n_00) {
    n_00 = 0x10000;
  }
  sVar3 = 0;
  do {
    if (uVar2 <= uVar1) {
      return sVar3;
    }
    local_40 = dynamic_vector_buffer<char,_std::allocator<char>_>::prepare(b,n_00);
    n = detail::
        memory_stream_impl<io::basic_string_view_stream<char,_std::char_traits<char>_>,_long>::
        read_some<io::net::mutable_buffer>
                  (&stream->
                    super_memory_stream_impl<io::basic_string_view_stream<char,_std::char_traits<char>_>,_long>
                   ,&local_40,ec);
    sVar3 = sVar3 + n;
    uVar4 = completion_condition.exact_ - sVar3;
    if (0xffff < uVar4) {
      uVar4 = 0x10000;
    }
    if (completion_condition.exact_ <= sVar3) {
      uVar4 = 0;
    }
    dynamic_vector_buffer<char,_std::allocator<char>_>::commit(b,n);
    if (ec->_M_value != 0) {
      uVar4 = 0;
    }
    uVar1 = b->size_;
    uVar2 = b->max_size_;
    n_00 = uVar2 - uVar1;
    if (uVar4 <= uVar2 - uVar1) {
      n_00 = uVar4;
    }
  } while (n_00 != 0);
  return sVar3;
}

Assistant:

std::size_t read(SyncReadStream& stream, DynamicBuffer&& b,
                 CompletionCondition completion_condition,
                 std::error_code& ec)
{
    ec.clear();

    std::size_t total_bytes_read = 0;
    const auto calc_next_read_size = [&b](std::size_t cc_return) {
        return std::min(cc_return, b.max_size() - b.size());
    };
    std::size_t next_read_size = calc_next_read_size(max_single_transfer_size);

    while (b.size() < b.max_size()) {
        auto buf = b.prepare(next_read_size);
        std::size_t bytes_read = stream.read_some(buf, ec);
        b.commit(bytes_read);
        total_bytes_read += bytes_read;
        next_read_size = calc_next_read_size(completion_condition(ec, total_bytes_read));
        if (next_read_size == 0) {
            break;
        }
    }

    return total_bytes_read;
}